

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cpp
# Opt level: O0

void __thiscall
testing::internal::UnorderedElementsAreMatcherImplBase::DescribeNegationToImpl
          (UnorderedElementsAreMatcherImplBase *this,ostream *os)

{
  bool bVar1;
  size_type sVar2;
  ostream *poVar3;
  const_reference ppMVar4;
  ulong local_50;
  size_t i;
  char *sep;
  UnorderedElementsAreMatcherImplBase local_38;
  undefined1 local_20 [16];
  ostream *os_local;
  UnorderedElementsAreMatcherImplBase *this_local;
  
  local_20._8_8_ = os;
  os_local = (ostream *)this;
  bVar1 = std::
          vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
          ::empty(&this->matcher_describers_);
  if (bVar1) {
    std::operator<<((ostream *)local_20._8_8_,"isn\'t empty");
  }
  else {
    sVar2 = std::
            vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
            ::size(&this->matcher_describers_);
    if (sVar2 == 1) {
      poVar3 = std::operator<<((ostream *)local_20._8_8_,"doesn\'t have ");
      Elements((UnorderedElementsAreMatcherImplBase *)local_20,1);
      poVar3 = testing::operator<<(poVar3,(Message *)local_20);
      poVar3 = std::operator<<(poVar3,", or has ");
      Elements(&local_38,1);
      poVar3 = testing::operator<<(poVar3,(Message *)&local_38);
      std::operator<<(poVar3," that ");
      Message::~Message((Message *)&local_38);
      Message::~Message((Message *)local_20);
      ppMVar4 = std::
                vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
                ::operator[](&this->matcher_describers_,0);
      (*(*ppMVar4)->_vptr_MatcherDescriberInterface[3])(*ppMVar4,local_20._8_8_);
    }
    else {
      poVar3 = std::operator<<((ostream *)local_20._8_8_,"doesn\'t have ");
      sVar2 = std::
              vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
              ::size(&this->matcher_describers_);
      Elements((UnorderedElementsAreMatcherImplBase *)&sep,sVar2);
      poVar3 = testing::operator<<(poVar3,(Message *)&sep);
      std::operator<<(poVar3,", or there exists no permutation of elements such that:\n");
      Message::~Message((Message *)&sep);
      i = (long)"%s from %s (%s ms total)\n\n" + 0x1a;
      local_50 = 0;
      while( true ) {
        sVar2 = std::
                vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
                ::size(&this->matcher_describers_);
        if (local_50 == sVar2) break;
        poVar3 = std::operator<<((ostream *)local_20._8_8_,(char *)i);
        poVar3 = std::operator<<(poVar3," - element #");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_50);
        std::operator<<(poVar3," ");
        ppMVar4 = std::
                  vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
                  ::operator[](&this->matcher_describers_,local_50);
        (*(*ppMVar4)->_vptr_MatcherDescriberInterface[2])(*ppMVar4,local_20._8_8_);
        i = (size_t)anon_var_dwarf_528f1;
        local_50 = local_50 + 1;
      }
    }
  }
  return;
}

Assistant:

void UnorderedElementsAreMatcherImplBase::DescribeNegationToImpl(
    ::std::ostream* os) const {
  if (matcher_describers_.empty()) {
    *os << "isn't empty";
    return;
  }
  if (matcher_describers_.size() == 1) {
    *os << "doesn't have " << Elements(1)
        << ", or has " << Elements(1) << " that ";
    matcher_describers_[0]->DescribeNegationTo(os);
    return;
  }
  *os << "doesn't have " << Elements(matcher_describers_.size())
      << ", or there exists no permutation of elements such that:\n";
  const char* sep = "";
  for (size_t i = 0; i != matcher_describers_.size(); ++i) {
    *os << sep << " - element #" << i << " ";
    matcher_describers_[i]->DescribeTo(os);
    sep = ", and\n";
  }
}